

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

_Bool rf_check_collision_circles(rf_vec2 center1,float radius1,rf_vec2 center2,float radius2)

{
  float fVar1;
  float fVar2;
  
  fVar1 = center2.x - center1.x;
  fVar2 = center2.y - center1.y;
  return SQRT(fVar1 * fVar1 + fVar2 * fVar2) <= radius1 + radius2;
}

Assistant:

bool rf_check_collision_circles(rf_vec2 center1, float radius1, rf_vec2 center2, float radius2)
{
    bool collision = false;

    float dx = center2.x - center1.x; // X distance between centers
    float dy = center2.y - center1.y; // Y distance between centers

    float distance = sqrt(dx * dx + dy * dy); // Distance between centers

    if (distance <= (radius1 + radius2)) collision = true;

    return collision;
}